

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.h
# Opt level: O1

int FindLatestHokuyoMessage(char *buf,int buflen,char **pFoundMsg,int *pFoundMsgTmpLen)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  undefined1 local_4a;
  undefined1 local_49;
  int i;
  int i_1;
  char **local_40;
  int *local_38;
  
  uVar6 = (ulong)(uint)buflen;
  local_40 = pFoundMsg;
  local_38 = pFoundMsgTmpLen;
  do {
    i = 0;
    local_4a = 0;
    iVar5 = (int)uVar6;
    if (((0x1c < iVar5) && (*buf == 'M')) && (buf[1] == 'D')) {
      iVar2 = __isoc99_sscanf(buf,"MD%04d%04d%02d%01d%02d\n99b\n%04d%c\n",&i,&i,&i,&i,&i,&i,
                              &local_4a);
      if (iVar2 == 7) {
        i = 0x19;
        uVar3 = 0x1a;
        do {
          if ((buf[uVar3 - 1] == '\n') && (buf[uVar3] == '\n')) {
            bVar1 = true;
            goto LAB_0012c776;
          }
          i = (int)uVar3;
          uVar3 = uVar3 + 1;
        } while (uVar6 != uVar3);
      }
    }
    buf = buf + 1;
    uVar6 = uVar6 - 1;
    if (iVar5 < 0x1e) {
      buf = (char *)0x0;
      uVar6 = 0;
      bVar1 = false;
LAB_0012c776:
      if (bVar1) {
        do {
          *local_40 = buf;
          *local_38 = (int)uVar6;
          uVar6 = (ulong)((int)uVar6 - 0x1d);
          pcVar7 = buf + 0x37;
          buf = buf + 0x1d;
          do {
            i_1 = 0;
            local_49 = 0;
            iVar5 = (int)uVar6;
            if (((0x1c < iVar5) && (*buf == 'M')) && (buf[1] == 'D')) {
              iVar2 = __isoc99_sscanf(buf,"MD%04d%04d%02d%01d%02d\n99b\n%04d%c\n",&i_1,&i_1,&i_1,
                                      &i_1,&i_1,&i_1,&local_49);
              if (iVar2 == 7) {
                lVar4 = 0;
                do {
                  if ((pcVar7[lVar4 + -1] == '\n') && (pcVar7[lVar4] == '\n')) {
                    bVar1 = true;
                    goto LAB_0012c846;
                  }
                  lVar4 = lVar4 + 1;
                } while (uVar6 - 0x1a != lVar4);
              }
            }
            buf = buf + 1;
            uVar6 = uVar6 - 1;
            pcVar7 = pcVar7 + 1;
          } while (0x1d < iVar5);
          buf = (char *)0x0;
          uVar6 = 0;
          bVar1 = false;
LAB_0012c846:
        } while (bVar1);
        iVar5 = 0;
      }
      else {
        *local_40 = (char *)0x0;
        *local_38 = 0;
        iVar5 = 1;
      }
      return iVar5;
    }
  } while( true );
}

Assistant:

inline int FindLatestHokuyoMessage(char* buf, int buflen, char** pFoundMsg, int* pFoundMsgTmpLen)
{
	char* ptr = NULL;
	int len = 0;
	int msglen = 0;

	if (FindHokuyoMessage(buf, buflen, &ptr, &len) != EXIT_SUCCESS)
	{
		*pFoundMsg = NULL;
		*pFoundMsgTmpLen = 0;
		return EXIT_FAILURE;
	}
	for (;;) 
	{
		// Save the position of the beginning of the message.
		*pFoundMsg = ptr;
		*pFoundMsgTmpLen = len;

		// Expected min message length.
		msglen = MIN_STANDARD_BUF_LEN_HOKUYO;

		// Search just after the message.
		if (FindHokuyoMessage(*pFoundMsg+msglen, *pFoundMsgTmpLen-msglen, &ptr, &len) != EXIT_SUCCESS)
		{
			break;
		}
	}

	return EXIT_SUCCESS;
}